

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  string_view fmt;
  string_view fmt_00;
  int __fd;
  char *pcVar1;
  int *piVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  int control;
  int port;
  timeval now_time;
  char *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  CLogger *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [10];
  CLogger *in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  int local_24;
  timeval local_20;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  CLogger::SetLevel(0x2593c0);
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  _current_time = local_20.tv_sec;
  pcVar1 = ctime((time_t *)&current_time);
  strcpy(&str_boot_time,pcVar1);
  _fpReserve = fopen("/dev/null","r");
  if (_fpReserve == (FILE *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    piVar2 = __errno_location();
    strerror(*piVar2);
    CLogger::Error<char_const(&)[10],char*>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    exit(0);
  }
  Config::GetValue_abi_cxx11_(&stack0xffffffffffffffa0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_24 = atoi(pcVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if (1 < local_8) {
    uVar3 = is_number((char *)local_10[1]);
    if ((uVar3 & 1) == 0) {
      fprintf(_stderr,"Usage: %s [port #]\n",*local_10);
      exit(0);
    }
    local_24 = atoi((char *)local_10[1]);
    if (local_24 == 0x29a) {
      CLogger::SetLevel(0x2593c0);
      bDebug = 1;
    }
    else if (local_24 < 0x401) {
      fprintf(_stderr,"Port number must be above 1024.\n");
      exit(0);
    }
  }
  _mPort = local_24;
  __fd = init_socket(local_24);
  uVar3 = CMud::Bootup();
  if ((uVar3 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CLogger::Info<int&>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                        (int *)in_stack_ffffffffffffffa0);
    game_loop_unix(__fd);
    close(__fd);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    fmt_00._M_str = *in_stack_ffffffffffffffa0;
    fmt_00._M_len = (size_t)in_stack_ffffffffffffff98;
    CLogger::Info<>(in_stack_ffffffffffffff90,fmt_00);
    exit(0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  fmt._M_str = *in_stack_ffffffffffffffa0;
  fmt._M_len = (size_t)in_stack_ffffffffffffff98;
  CLogger::Error<>(in_stack_ffffffffffffff90,fmt);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	struct timeval now_time;
	int port = 0;
	int control;

	RS.Logger.SetLevel(spdlog::level::info);

	/*
	 * Memory debugging if needed.
	 */
#ifdef MALLOC_DEBUG
	malloc_debug(2);
#endif

	/*
	 * Init time.
	 */
	gettimeofday(&now_time, nullptr);
	current_time = (time_t)now_time.tv_sec;
	strcpy(str_boot_time, ctime(&current_time));

	/*
	 * Reserve one channel for our use.
	 */
	if ((fpReserve = fopen(NULL_FILE, "r")) == nullptr)
	{
		RS.Logger.Error("Main: fopen {}: {}", NULL_FILE, std::strerror(errno));
		exit(0);
	}

	/*
	 * Get the port number.
	 */
	port = atoi(RS.SQL.Settings.GetValue("Port").c_str());
	if (argc > 1)
	{
		if (!is_number(argv[1]))
		{
			fprintf(stderr, "Usage: %s [port #]\n", argv[0]);
			exit(0);
		}
		else if ((port = atoi(argv[1])) == 666)
		{
			RS.Logger.SetLevel(spdlog::level::debug);
			bDebug = true;
		}
		else if (port <= 1024)
		{
			fprintf(stderr, "Port number must be above 1024.\n");
			exit(0);
		}
	}

	mPort = port;

	/*
	 * Run the game.
	 */
	control = init_socket(port);

	// boot_db( );
	if (!RS.Bootup())
	{
		RS.Logger.Error("Riftshadow failed to boot, aborting.");
		exit(0);
		return 0;
	}

	RS.Logger.Info("Riftshadow booted, binding on port {}.", port);

	game_loop_unix(control);
	close(control);

	/*
	 * That's all, folks.
	 */
	RS.Logger.Info("Normal termination of game.");
	exit(0);
	return 0;
}